

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

bool crn_decompress_block(void *pSrc_block,crn_uint32 *pDst_pixels_u32,crn_format crn_fmt)

{
  uint uVar1;
  uint uVar2;
  crn_format cVar3;
  dxt1_block *this;
  dxt5_block *this_00;
  color_quad<unsigned_char,_int> *local_1e0;
  color_quad<unsigned_char,_int> *local_1b8;
  color_quad<unsigned_char,_int> *local_190;
  uint local_17c;
  uint s_3;
  uint i_4;
  uint values_1 [8];
  dxt5_block *pDXT5_block_1;
  uint s1;
  uint s0;
  uint i_3;
  uint values1 [8];
  uint values0 [8];
  dxt5_block *pDXT5_block1;
  dxt5_block *pDXT5_block0;
  uint a_1;
  uint s_2;
  uint i_2;
  uint values [8];
  color_quad_u8 colors_2 [4];
  dxt1_block *pDXT1_block_2;
  dxt5_block *pDXT5_block;
  uint a;
  uint s_1;
  uint i_1;
  color_quad_u8 colors_1 [4];
  dxt1_block *pDXT1_block_1;
  dxt3_block *pDXT3_block;
  uint s;
  uint i;
  color_quad_u8 colors [4];
  dxt1_block *pDXT1_block;
  etc1_block *block;
  color_quad_u8 *pDst_pixels;
  crn_format crn_fmt_local;
  crn_uint32 *pDst_pixels_u32_local;
  void *pSrc_block_local;
  
  cVar3 = crn_get_fundamental_dxt_format(crn_fmt);
  switch(cVar3) {
  case cCRNFmtDXT1:
    local_190 = (color_quad<unsigned_char,_int> *)&s;
    do {
      crnlib::color_quad<unsigned_char,_int>::color_quad(local_190);
      local_190 = local_190 + 1;
    } while (local_190 != colors + 2);
    uVar1 = crnlib::dxt1_block::get_low_color((dxt1_block *)pSrc_block);
    uVar2 = crnlib::dxt1_block::get_high_color((dxt1_block *)pSrc_block);
    crnlib::dxt1_block::get_block_colors((color_quad_u8 *)&s,(uint16)uVar1,(uint16)uVar2);
    for (pDXT3_block._4_4_ = 0; pDXT3_block._4_4_ < 0x10; pDXT3_block._4_4_ = pDXT3_block._4_4_ + 1)
    {
      uVar1 = crnlib::dxt1_block::get_selector
                        ((dxt1_block *)pSrc_block,pDXT3_block._4_4_ & 3,pDXT3_block._4_4_ >> 2);
      crnlib::color_quad<unsigned_char,_int>::operator=
                ((color_quad<unsigned_char,_int> *)(pDst_pixels_u32 + pDXT3_block._4_4_),
                 (color_quad<unsigned_char,_int> *)(&s + uVar1));
    }
    break;
  case cCRNFmtDXT3:
    this = (dxt1_block *)((long)pSrc_block + 8);
    local_1b8 = (color_quad<unsigned_char,_int> *)&s_1;
    do {
      crnlib::color_quad<unsigned_char,_int>::color_quad(local_1b8);
      local_1b8 = local_1b8 + 1;
    } while (local_1b8 != colors_1 + 2);
    uVar1 = crnlib::dxt1_block::get_low_color(this);
    uVar2 = crnlib::dxt1_block::get_high_color(this);
    crnlib::dxt1_block::get_block_colors((color_quad_u8 *)&s_1,(uint16)uVar1,(uint16)uVar2);
    for (a = 0; a < 0x10; a = a + 1) {
      uVar1 = crnlib::dxt1_block::get_selector(this,a & 3,a >> 2);
      uVar2 = crnlib::dxt3_block::get_alpha((dxt3_block *)pSrc_block,a & 3,a >> 2,true);
      crnlib::color_quad<unsigned_char,_int>::operator=
                ((color_quad<unsigned_char,_int> *)(pDst_pixels_u32 + a),
                 (color_quad<unsigned_char,_int> *)(&s_1 + uVar1));
      *(char *)((long)pDst_pixels_u32 + (ulong)a * 4 + 3) = (char)uVar2;
    }
    break;
  case cCRNFmtDXT5:
    colors_2._8_8_ = (long)pSrc_block + 8;
    local_1e0 = (color_quad<unsigned_char,_int> *)(values + 6);
    do {
      crnlib::color_quad<unsigned_char,_int>::color_quad(local_1e0);
      local_1e0 = local_1e0 + 1;
    } while (local_1e0 != colors_2 + 2);
    uVar1 = crnlib::dxt1_block::get_low_color((dxt1_block *)colors_2._8_8_);
    uVar2 = crnlib::dxt1_block::get_high_color((dxt1_block *)colors_2._8_8_);
    crnlib::dxt1_block::get_block_colors((color_quad_u8 *)(values + 6),(uint16)uVar1,(uint16)uVar2);
    uVar1 = crnlib::dxt5_block::get_low_alpha((dxt5_block *)pSrc_block);
    uVar2 = crnlib::dxt5_block::get_high_alpha((dxt5_block *)pSrc_block);
    crnlib::dxt5_block::get_block_values(&s_2,uVar1,uVar2);
    for (a_1 = 0; a_1 < 0x10; a_1 = a_1 + 1) {
      uVar1 = crnlib::dxt1_block::get_selector((dxt1_block *)colors_2._8_8_,a_1 & 3,a_1 >> 2);
      uVar2 = crnlib::dxt5_block::get_selector((dxt5_block *)pSrc_block,a_1 & 3,a_1 >> 2);
      crnlib::color_quad<unsigned_char,_int>::operator=
                ((color_quad<unsigned_char,_int> *)(pDst_pixels_u32 + a_1),
                 (color_quad<unsigned_char,_int> *)(values + (ulong)uVar1 + 6));
      *(char *)((long)pDst_pixels_u32 + (ulong)a_1 * 4 + 3) = (char)(&s_2)[uVar2];
    }
  case cCRNFmtDXN_XY:
  case cCRNFmtDXN_YX:
    this_00 = (dxt5_block *)((long)pSrc_block + 8);
    uVar1 = crnlib::dxt5_block::get_low_alpha((dxt5_block *)pSrc_block);
    uVar2 = crnlib::dxt5_block::get_high_alpha((dxt5_block *)pSrc_block);
    crnlib::dxt5_block::get_block_values(values1 + 6,uVar1,uVar2);
    uVar1 = crnlib::dxt5_block::get_low_alpha(this_00);
    uVar2 = crnlib::dxt5_block::get_high_alpha(this_00);
    crnlib::dxt5_block::get_block_values(&s0,uVar1,uVar2);
    for (s1 = 0; s1 < 0x10; s1 = s1 + 1) {
      uVar1 = crnlib::dxt5_block::get_selector((dxt5_block *)pSrc_block,s1 & 3,s1 >> 2);
      uVar2 = crnlib::dxt5_block::get_selector(this_00,s1 & 3,s1 >> 2);
      if (crn_fmt == cCRNFmtDXN_XY) {
        crnlib::color_quad<unsigned_char,_int>::set_noclamp_rgba
                  ((color_quad<unsigned_char,_int> *)(pDst_pixels_u32 + s1),
                   values1[(ulong)uVar1 + 6],(&s0)[uVar2],0xff,0xff);
      }
      else {
        crnlib::color_quad<unsigned_char,_int>::set_noclamp_rgba
                  ((color_quad<unsigned_char,_int> *)(pDst_pixels_u32 + s1),(&s0)[uVar2],
                   values1[(ulong)uVar1 + 6],0xff,0xff);
      }
    }
    break;
  default:
    return false;
  case cCRNFmtDXT5A:
    uVar1 = crnlib::dxt5_block::get_low_alpha((dxt5_block *)pSrc_block);
    uVar2 = crnlib::dxt5_block::get_high_alpha((dxt5_block *)pSrc_block);
    crnlib::dxt5_block::get_block_values(&s_3,uVar1,uVar2);
    for (local_17c = 0; local_17c < 0x10; local_17c = local_17c + 1) {
      uVar1 = crnlib::dxt5_block::get_selector
                        ((dxt5_block *)pSrc_block,local_17c & 3,local_17c >> 2);
      crnlib::color_quad<unsigned_char,_int>::set_noclamp_rgba
                ((color_quad<unsigned_char,_int> *)(pDst_pixels_u32 + local_17c),0xff,0xff,0xff,
                 (&s_3)[uVar1]);
    }
    break;
  case cCRNFmtETC1:
    crnlib::unpack_etc1((etc1_block *)pSrc_block,(color_quad_u8 *)pDst_pixels_u32,false);
  }
  return true;
}

Assistant:

bool crn_decompress_block(const void* pSrc_block, crn_uint32* pDst_pixels_u32, crn_format crn_fmt)
{
    color_quad_u8* pDst_pixels = reinterpret_cast<color_quad_u8*>(pDst_pixels_u32);

    switch (crn_get_fundamental_dxt_format(crn_fmt))
    {
    case cCRNFmtETC1:
    {
        const etc1_block& block = *reinterpret_cast<const etc1_block*>(pSrc_block);
        unpack_etc1(block, pDst_pixels, false);
        break;
    }
    case cCRNFmtDXT1:
    {
        const dxt1_block* pDXT1_block = reinterpret_cast<const dxt1_block*>(pSrc_block);

        color_quad_u8 colors[cDXT1SelectorValues];
        pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT1_block->get_selector(i & 3, i >> 2);

            pDst_pixels[i] = colors[s];
        }

        break;
    }

    case cCRNFmtDXT3:
    {
        const dxt3_block* pDXT3_block = reinterpret_cast<const dxt3_block*>(pSrc_block);

        const dxt1_block* pDXT1_block = reinterpret_cast<const dxt1_block*>(pSrc_block) + 1;
        color_quad_u8 colors[cDXT1SelectorValues];
        pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT1_block->get_selector(i & 3, i >> 2);
            const uint a = pDXT3_block->get_alpha(i & 3, i >> 2, true);

            pDst_pixels[i] = colors[s];
            pDst_pixels[i].a = static_cast<uint8>(a);
        }

        break;
    }

    case cCRNFmtDXT5:
    {
        const dxt5_block* pDXT5_block = reinterpret_cast<const dxt5_block*>(pSrc_block);

        const dxt1_block* pDXT1_block = reinterpret_cast<const dxt1_block*>(pSrc_block) + 1;
        color_quad_u8 colors[cDXT1SelectorValues];
        pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

        uint values[cDXT5SelectorValues];
        dxt5_block::get_block_values(values, pDXT5_block->get_low_alpha(), pDXT5_block->get_high_alpha());

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT1_block->get_selector(i & 3, i >> 2);
            const uint a = pDXT5_block->get_selector(i & 3, i >> 2);

            pDst_pixels[i] = colors[s];
            pDst_pixels[i].a = static_cast<uint8>(values[a]);
        }
    }

    case cCRNFmtDXN_XY:
    case cCRNFmtDXN_YX:
    {
        const dxt5_block* pDXT5_block0 = reinterpret_cast<const dxt5_block*>(pSrc_block);
        const dxt5_block* pDXT5_block1 = reinterpret_cast<const dxt5_block*>(pSrc_block) + 1;

        uint values0[cDXT5SelectorValues];
        dxt5_block::get_block_values(values0, pDXT5_block0->get_low_alpha(), pDXT5_block0->get_high_alpha());

        uint values1[cDXT5SelectorValues];
        dxt5_block::get_block_values(values1, pDXT5_block1->get_low_alpha(), pDXT5_block1->get_high_alpha());

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s0 = pDXT5_block0->get_selector(i & 3, i >> 2);
            const uint s1 = pDXT5_block1->get_selector(i & 3, i >> 2);

            if (crn_fmt == cCRNFmtDXN_XY)
            {
                pDst_pixels[i].set_noclamp_rgba(values0[s0], values1[s1], 255, 255);
            }
            else
            {
                pDst_pixels[i].set_noclamp_rgba(values1[s1], values0[s0], 255, 255);
            }
        }
        
        break;
    }

    case cCRNFmtDXT5A:
    {
        const dxt5_block* pDXT5_block = reinterpret_cast<const dxt5_block*>(pSrc_block);

        uint values[cDXT5SelectorValues];
        dxt5_block::get_block_values(values, pDXT5_block->get_low_alpha(), pDXT5_block->get_high_alpha());

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT5_block->get_selector(i & 3, i >> 2);

            pDst_pixels[i].set_noclamp_rgba(255, 255, 255, values[s]);
        }

        break;
    }
    default:
    {
        return false;
    }
    }

    return true;
}